

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

int gtStripContig(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  TIFF *pTVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  tmsize_t tVar6;
  uint uVar7;
  ulong uVar8;
  char *fmt;
  uint32_t uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint32_t *puVar13;
  uint32_t *puVar14;
  uint uVar15;
  bool bVar16;
  int local_a4;
  uint16_t subsamplingver;
  uint local_98;
  uint32_t rowsperstrip;
  uchar *buf;
  ulong local_88;
  ulong local_80;
  uint16_t subsamplinghor;
  ulong local_70;
  uint32_t *local_68;
  ulong local_60;
  TIFF *local_58;
  ulong local_50;
  ulong local_48;
  anon_union_8_3_994a2fbf_for_put local_40;
  tmsize_t local_38;
  
  uVar8 = (ulong)w;
  pTVar1 = img->tif;
  local_40 = img->put;
  buf = (uchar *)0x0;
  local_80 = (ulong)img->width;
  local_60 = 0;
  TIFFGetFieldDefaulted(pTVar1,0x212,&subsamplinghor,&subsamplingver);
  if (subsamplingver == 0) {
    pcVar5 = TIFFFileName(pTVar1);
    fmt = "Invalid vertical YCbCr subsampling";
LAB_002a4df1:
    local_a4 = 0;
    TIFFErrorExtR(pTVar1,pcVar5,fmt);
  }
  else {
    local_38 = TIFFStripSize(pTVar1);
    local_98 = setorientation(img);
    if ((local_98 & 1) != 0) {
      if ((int)w < 0) {
        pcVar5 = TIFFFileName(pTVar1);
        fmt = "Width overflow";
        goto LAB_002a4df1;
      }
      local_60 = (ulong)(w * -2);
    }
    local_68 = raster;
    TIFFGetFieldDefaulted(pTVar1,0x116,&rowsperstrip);
    uVar4 = TIFFScanlineSize(pTVar1);
    uVar15 = (uint)local_80;
    local_80 = (ulong)(uVar15 - w);
    if (uVar15 < w) {
      local_80 = 0;
    }
    local_70 = uVar8;
    if (h == 0) {
      local_a4 = 1;
      uVar4 = (ulong)h;
    }
    else {
      local_a4 = 1;
      uVar15 = 0;
      local_88 = uVar8;
      local_58 = pTVar1;
      local_50 = (ulong)h;
      local_48 = uVar4;
      do {
        uVar4 = local_48;
        pTVar1 = local_58;
        uVar9 = img->row_offset + uVar15;
        uVar7 = uVar9 % rowsperstrip;
        uVar11 = rowsperstrip - uVar7;
        uVar3 = (uint)local_50 - uVar15;
        if (uVar11 + uVar15 <= (uint)local_50) {
          uVar3 = uVar11;
        }
        iVar12 = (uint)subsamplingver - uVar3 % (uint)subsamplingver;
        if (uVar3 % (uint)subsamplingver == 0) {
          iVar12 = 0;
        }
        uVar10 = (ulong)(uVar7 + uVar3 + iVar12);
        if (((long)local_48 < 1) ||
           (auVar2._8_8_ = 0, auVar2._0_8_ = local_48,
           uVar10 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0))) {
          uVar9 = TIFFComputeStrip(local_58,uVar9,0);
          tVar6 = _TIFFReadEncodedStripAndAllocBuffer(pTVar1,uVar9,&buf,local_38,uVar10 * uVar4);
          uVar8 = local_88;
          if ((tVar6 == -1) && ((iVar12 = 2, buf == (uchar *)0x0 || (img->stoponerr != 0)))) {
            local_a4 = 0;
          }
          else {
            iVar12 = 0;
            (*local_40.any)(img);
          }
        }
        else {
          pcVar5 = TIFFFileName(local_58);
          TIFFErrorExtR(pTVar1,pcVar5,"Integer overflow in gtStripContig");
          iVar12 = 1;
        }
        w = (uint32_t)uVar8;
        uVar4 = local_50;
        if (iVar12 != 0) {
          if (iVar12 != 2) {
            return 0;
          }
          break;
        }
        uVar15 = uVar3 + uVar15;
      } while (uVar15 < (uint)local_50);
    }
    if ((int)uVar4 != 0 && 1 < local_98) {
      uVar8 = 0;
      uVar10 = 0;
      do {
        puVar13 = local_68 + (int)uVar10 * w + (local_70 - 1);
        if (local_68 + (int)uVar10 * w < puVar13) {
          puVar14 = local_68 + uVar8 + 1;
          do {
            uVar9 = puVar14[-1];
            puVar14[-1] = *puVar13;
            *puVar13 = uVar9;
            puVar13 = puVar13 + -1;
            bVar16 = puVar14 < puVar13;
            puVar14 = puVar14 + 1;
          } while (bVar16);
        }
        uVar10 = uVar10 + 1;
        uVar8 = (ulong)((int)uVar8 + w);
      } while (uVar10 != (uVar4 & 0xffffffff));
    }
    _TIFFfreeExt(img->tif,buf);
  }
  return local_a4;
}

Assistant:

static int gtStripContig(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                         uint32_t h)
{
    TIFF *tif = img->tif;
    tileContigRoutine put = img->put.contig;
    uint32_t row, y, nrow, nrowsub, rowstoread;
    tmsize_t pos;
    unsigned char *buf = NULL;
    uint32_t rowsperstrip;
    uint16_t subsamplinghor, subsamplingver;
    uint32_t imagewidth = img->width;
    tmsize_t scanline;
    int32_t fromskew, toskew;
    int ret = 1, flip;
    tmsize_t maxstripsize;

    TIFFGetFieldDefaulted(tif, TIFFTAG_YCBCRSUBSAMPLING, &subsamplinghor,
                          &subsamplingver);
    if (subsamplingver == 0)
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Invalid vertical YCbCr subsampling");
        return (0);
    }

    maxstripsize = TIFFStripSize(tif);

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if (w > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "Width overflow");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(w + w);
    }
    else
    {
        y = 0;
        toskew = -(int32_t)(w - w);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);

    scanline = TIFFScanlineSize(tif);
    fromskew = (w < imagewidth ? imagewidth - w : 0);
    for (row = 0; row < h; row += nrow)
    {
        uint32_t temp;
        rowstoread = rowsperstrip - (row + img->row_offset) % rowsperstrip;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        nrowsub = nrow;
        if ((nrowsub % subsamplingver) != 0)
            nrowsub += subsamplingver - nrowsub % subsamplingver;
        temp = (row + img->row_offset) % rowsperstrip + nrowsub;
        if (scanline > 0 && temp > (size_t)(TIFF_TMSIZE_T_MAX / scanline))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif),
                          "Integer overflow in gtStripContig");
            return 0;
        }
        if (_TIFFReadEncodedStripAndAllocBuffer(
                tif, TIFFComputeStrip(tif, row + img->row_offset, 0),
                (void **)(&buf), maxstripsize,
                temp * scanline) == (tmsize_t)(-1) &&
            (buf == NULL || img->stoponerr))
        {
            ret = 0;
            break;
        }

        pos = ((row + img->row_offset) % rowsperstrip) * scanline +
              ((tmsize_t)img->col_offset * img->samplesperpixel);
        tmsize_t roffset = (tmsize_t)y * w;
        (*put)(img, raster + roffset, 0, y, w, nrow, fromskew, toskew,
               buf + pos);
        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}